

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

void __thiscall wasm::Vacuum::visitIf(Vacuum *this,If *curr)

{
  Id IVar1;
  Id IVar2;
  If *pIVar3;
  If *pIVar4;
  bool bVar5;
  int64_t iVar6;
  If *pIVar7;
  Drop *pDVar8;
  Nop *output;
  optional<wasm::Type> type_;
  undefined1 local_30 [8];
  anon_class_16_2_3fdeafed optimizeArm;
  If *curr_local;
  
  pIVar7 = (If *)curr->condition;
  optimizeArm.curr = (If **)curr;
  if ((pIVar7->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id == ConstId) {
    iVar6 = Literal::getInteger((Literal *)&pIVar7->condition);
    if (iVar6 == 0) {
      pIVar7 = (If *)curr->ifFalse;
      if (pIVar7 == (If *)0x0) {
        (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = NopId;
        (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
        return;
      }
    }
    else {
      pIVar7 = (If *)curr->ifTrue;
    }
  }
  else if ((pIVar7->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1
          ) {
    if (((((this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
           ).super_Pass.runner)->options).trapsNeverHappen == true) &&
       ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1)) {
      optimizeArm.this = (Vacuum *)&optimizeArm.curr;
      local_30 = (undefined1  [8])this;
      bVar5 = visitIf::anon_class_16_2_3fdeafed::operator()
                        ((anon_class_16_2_3fdeafed *)local_30,curr->ifTrue,curr->ifFalse);
      if (bVar5) {
        return;
      }
      pIVar7 = optimizeArm.curr[4];
      if ((pIVar7 != (If *)0x0) &&
         (bVar5 = visitIf::anon_class_16_2_3fdeafed::operator()
                            ((anon_class_16_2_3fdeafed *)local_30,(Expression *)pIVar7,
                             (Expression *)optimizeArm.curr[3]), bVar5)) {
        return;
      }
    }
    pIVar3 = optimizeArm.curr[4];
    if (pIVar3 == (If *)0x0) {
      if ((optimizeArm.curr[3]->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
          _id != NopId) {
        return;
      }
      local_30 = (undefined1  [8])
                 (this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                 super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                 super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
      pIVar7 = optimizeArm.curr[2];
    }
    else {
      IVar1 = (pIVar3->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id;
      if (IVar1 == NopId) {
        optimizeArm.curr[4] = (If *)0x0;
        return;
      }
      IVar2 = (optimizeArm.curr[3]->super_SpecificExpression<(wasm::Expression::Id)2>).
              super_Expression._id;
      if (IVar2 != DropId) {
        if (IVar2 != NopId) {
          return;
        }
        optimizeArm.curr[3] = pIVar3;
        optimizeArm.curr[4] = (If *)0x0;
        local_30 = (undefined1  [8])
                   (this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                   ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                   super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                   super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
        pIVar7 = (If *)Builder::makeUnary((Builder *)local_30,EqZInt32,
                                          (Expression *)optimizeArm.curr[2]);
        optimizeArm.curr[2] = pIVar7;
        return;
      }
      if (IVar1 != DropId) {
        return;
      }
      pDVar8 = Expression::cast<wasm::Drop>((Expression *)optimizeArm.curr[3]);
      pIVar3 = (If *)pDVar8->value;
      pDVar8 = Expression::cast<wasm::Drop>((Expression *)optimizeArm.curr[4]);
      pIVar4 = (If *)pDVar8->value;
      if ((pIVar3->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id !=
          (pIVar4->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id) {
        return;
      }
      optimizeArm.curr[3] = pIVar3;
      optimizeArm.curr[4] = pIVar4;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pIVar7;
      If::finalize((If *)optimizeArm.curr,type_);
      local_30 = (undefined1  [8])
                 (this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                 super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                 super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
      pIVar7 = (If *)optimizeArm.curr;
    }
    pDVar8 = Builder::makeDrop((Builder *)local_30,(Expression *)pIVar7);
    ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               (Expression *)pDVar8);
    return;
  }
  ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
              ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
             (Expression *)pIVar7);
  return;
}

Assistant:

void visitIf(If* curr) {
    // if the condition is a constant, just apply it
    // we can just return the ifTrue or ifFalse.
    if (auto* value = curr->condition->dynCast<Const>()) {
      Expression* child;
      if (value->value.getInteger()) {
        child = curr->ifTrue;
      } else {
        if (curr->ifFalse) {
          child = curr->ifFalse;
        } else {
          ExpressionManipulator::nop(curr);
          return;
        }
      }
      replaceCurrent(child);
      return;
    }
    // if the condition is unreachable, just return it
    if (curr->condition->type == Type::unreachable) {
      replaceCurrent(curr->condition);
      return;
    }
    // from here on, we can assume the condition executed

    // In trapsNeverHappen mode, a definitely-trapping arm can be assumed to not
    // happen. Such conditional code can be assumed to never be reached in this
    // mode.
    //
    // Ignore the case of an unreachable if, such as having both arms be
    // unreachable. In that case we'd need to fix up the IR to avoid changing
    // the type; leave that for DCE to simplify first. After checking that
    // curr->type != unreachable, we can assume that only one of the arms is
    // unreachable (at most).
    if (getPassOptions().trapsNeverHappen && curr->type != Type::unreachable) {
      auto optimizeArm = [&](Expression* arm, Expression* otherArm) {
        if (!arm->is<Unreachable>()) {
          return false;
        }
        Builder builder(*getModule());
        Expression* rep = builder.makeDrop(curr->condition);
        if (otherArm) {
          rep = builder.makeSequence(rep, otherArm);
        }
        replaceCurrent(rep);
        return true;
      };

      // As mentioned above, do not try to optimize both arms; leave that case
      // for DCE.
      if (optimizeArm(curr->ifTrue, curr->ifFalse) ||
          (curr->ifFalse && optimizeArm(curr->ifFalse, curr->ifTrue))) {
        return;
      }
    }

    if (curr->ifFalse) {
      if (curr->ifFalse->is<Nop>()) {
        curr->ifFalse = nullptr;
      } else if (curr->ifTrue->is<Nop>()) {
        curr->ifTrue = curr->ifFalse;
        curr->ifFalse = nullptr;
        curr->condition =
          Builder(*getModule()).makeUnary(EqZInt32, curr->condition);
      } else if (curr->ifTrue->is<Drop>() && curr->ifFalse->is<Drop>()) {
        // instead of dropping both sides, drop the if, if they are the same
        // type
        auto* left = curr->ifTrue->cast<Drop>()->value;
        auto* right = curr->ifFalse->cast<Drop>()->value;
        if (left->type == right->type) {
          curr->ifTrue = left;
          curr->ifFalse = right;
          curr->finalize();
          replaceCurrent(Builder(*getModule()).makeDrop(curr));
        }
      }
    } else {
      // This is an if without an else. If the body is empty, we do not need it.
      if (curr->ifTrue->is<Nop>()) {
        replaceCurrent(Builder(*getModule()).makeDrop(curr->condition));
      }
    }
  }